

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_intra_pred_filters.c
# Opt level: O1

void ihevc_intra_pred_luma_mode_3_to_9
               (UWORD8 *pu1_ref,WORD32 src_strd,UWORD8 *pu1_dst,WORD32 dst_strd,WORD32 nt,
               WORD32 mode)

{
  int iVar1;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  UWORD8 *pUVar6;
  
  if (0 < nt) {
    iVar1 = gai4_ihevc_ang_table[mode];
    uVar2 = 0;
    do {
      uVar2 = uVar2 + 1;
      uVar3 = (int)uVar2 * iVar1;
      iVar4 = (nt * 2 + -1) - ((int)uVar3 >> 5);
      uVar3 = uVar3 & 0x1f;
      uVar5 = (ulong)(uint)nt;
      pUVar6 = pu1_dst;
      do {
        *pUVar6 = (UWORD8)((uint)pu1_ref[iVar4] * (0x20 - uVar3) + pu1_ref[(long)iVar4 + -1] * uVar3
                           + 0x10 >> 5);
        pUVar6 = pUVar6 + dst_strd;
        iVar4 = iVar4 + -1;
        uVar5 = uVar5 - 1;
      } while (uVar5 != 0);
      pu1_dst = pu1_dst + 1;
    } while (uVar2 != (uint)nt);
  }
  return;
}

Assistant:

void ihevc_intra_pred_luma_mode_3_to_9(UWORD8 *pu1_ref,
                                       WORD32 src_strd,
                                       UWORD8 *pu1_dst,
                                       WORD32 dst_strd,
                                       WORD32 nt,
                                       WORD32 mode)
{
    WORD32 row, col;
    WORD32 two_nt = 2 * nt;
    WORD32 intra_pred_ang;
    WORD32 idx, ref_main_idx;
    WORD32 pos, fract;
    UNUSED(src_strd);
    /* Intra Pred Angle according to the mode */
    intra_pred_ang = gai4_ihevc_ang_table[mode];

    /* For the angles other then 45 degree, interpolation btw 2 neighboring */
    /* samples dependent on distance to obtain destination sample */

    for(col = 0; col < nt; col++)
    {
        pos = ((col + 1) * intra_pred_ang);
        idx = pos >> 5;
        fract = pos & (31);

        // Do linear filtering
        for(row = 0; row < nt; row++)
        {
            ref_main_idx = two_nt - row - idx - 1;
            pu1_dst[col + (row * dst_strd)] = (((32 - fract)
                            * pu1_ref[ref_main_idx]
                            + fract * pu1_ref[ref_main_idx - 1] + 16) >> 5);
        }

    }

}